

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::SkipMessageSetField
               (CodedInputStream *input,uint32_t field_number,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  ulong uVar4;
  string *buffer;
  uint32_t first_byte_or_zero;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_00484a49;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  if ((long)uVar4 < 0) {
    return false;
  }
LAB_00484a49:
  buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,field_number);
  bVar3 = io::CodedInputStream::ReadString(input,buffer,(int)uVar4);
  return bVar3;
}

Assistant:

bool WireFormat::SkipMessageSetField(io::CodedInputStream* input,
                                     uint32_t field_number,
                                     UnknownFieldSet* unknown_fields) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  return input->ReadString(unknown_fields->AddLengthDelimited(field_number),
                           length);
}